

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O2

void __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadGeometryVertexBuffer
          (OgreXmlSerializer *this,VertexDataXml *dest)

{
  string *__lhs;
  pointer pvVar1;
  bool bVar2;
  pointer pvVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Logger *pLVar11;
  long lVar12;
  DeadlyImportError *pDVar13;
  bool bVar14;
  ulong uVar15;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *this_00;
  pointer pvVar16;
  long lVar17;
  bool bVar18;
  float fVar19;
  uint local_1fc;
  string local_1e0;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_1c0;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_1b8;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_1b0;
  undefined1 local_1a8 [8];
  float local_1a0;
  
  iVar10 = (*this->m_reader->_vptr_IIrrXMLReader[7])(this->m_reader,"positions");
  if (CONCAT44(extraout_var,iVar10) == 0) {
    bVar4 = false;
  }
  else {
    bVar4 = ReadAttribute<bool>(this,"positions");
  }
  iVar10 = (*this->m_reader->_vptr_IIrrXMLReader[7])(this->m_reader,"normals");
  if (CONCAT44(extraout_var_00,iVar10) == 0) {
    bVar5 = false;
  }
  else {
    bVar5 = ReadAttribute<bool>(this,"normals");
  }
  iVar10 = (*this->m_reader->_vptr_IIrrXMLReader[7])(this->m_reader,"tangents");
  local_1fc = 0;
  if (CONCAT44(extraout_var_01,iVar10) == 0) {
    bVar6 = false;
  }
  else {
    bVar6 = ReadAttribute<bool>(this,"tangents");
  }
  iVar10 = (*this->m_reader->_vptr_IIrrXMLReader[7])(this->m_reader,"texture_coords");
  if (CONCAT44(extraout_var_02,iVar10) != 0) {
    local_1fc = ReadAttribute<unsigned_int>(this,"texture_coords");
  }
  if (bVar4 == false) {
    bVar18 = VertexDataXml::HasPositions(dest);
    if (!bVar18) {
      pDVar13 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)local_1a8,"Vertex buffer does not contain positions!",
                 (allocator *)&local_1e0);
      DeadlyImportError::DeadlyImportError(pDVar13,(string *)local_1a8);
      __cxa_throw(pDVar13,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    pLVar11 = DefaultLogger::get();
    Logger::debug(pLVar11,"    - Contains positions");
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
              (&dest->positions,(ulong)(dest->super_IVertexData).count);
  }
  if (bVar5 != false) {
    pLVar11 = DefaultLogger::get();
    Logger::debug(pLVar11,"    - Contains normals");
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
              (&dest->normals,(ulong)(dest->super_IVertexData).count);
  }
  if (bVar6 != false) {
    pLVar11 = DefaultLogger::get();
    Logger::debug(pLVar11,"    - Contains tangents");
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
              (&dest->tangents,(ulong)(dest->super_IVertexData).count);
  }
  if (local_1fc != 0) {
    pLVar11 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[16]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [16])"    - Contains ");
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::operator<<((ostream *)local_1a8," texture coords");
    std::__cxx11::stringbuf::str();
    Logger::debug(pLVar11,local_1e0._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::
    vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
    ::resize(&dest->uvs,(ulong)local_1fc);
    lVar12 = ((long)(dest->uvs).
                    super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(dest->uvs).
                   super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18;
    lVar17 = 0;
    while (bVar18 = lVar12 != 0, lVar12 = lVar12 + -1, bVar18) {
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                 ((long)&(((dest->uvs).
                           super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
                         ._M_impl.super__Vector_impl_data._M_start + lVar17),
                 (ulong)(dest->super_IVertexData).count);
      lVar17 = lVar17 + 0x18;
    }
  }
  NextNode_abi_cxx11_(this);
  __lhs = &this->m_currentNodeName;
  local_1c0 = &dest->tangents;
  local_1b8 = &dest->normals;
  local_1b0 = &dest->positions;
  bVar18 = true;
  bVar7 = true;
  bVar14 = true;
  do {
    while( true ) {
      bVar8 = std::operator==(__lhs,"vertex");
      if (((((!bVar8) && (bVar8 = std::operator==(__lhs,"position"), !bVar8)) &&
           (bVar8 = std::operator==(__lhs,"normal"), !bVar8)) &&
          ((bVar8 = std::operator==(__lhs,"tangent"), !bVar8 &&
           (bVar8 = std::operator==(__lhs,"binormal"), !bVar8)))) &&
         ((bVar8 = std::operator==(__lhs,"texcoord"), !bVar8 &&
          ((bVar8 = std::operator==(__lhs,"colour_diffuse"), !bVar8 &&
           (bVar8 = std::operator==(__lhs,"colour_specular"), !bVar8)))))) {
        lVar12 = (long)(dest->positions).
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(dest->positions).
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        if (lVar12 / 0xc != (ulong)(dest->super_IVertexData).count) {
          pDVar13 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::operator<<((ostream *)local_1a8,"Read only ");
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::operator<<((ostream *)local_1a8," positions when should have read ");
          Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                    ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a8,
                     (uint *)dest);
          std::__cxx11::stringbuf::str();
          DeadlyImportError::DeadlyImportError(pDVar13,&local_1e0);
          __cxa_throw(pDVar13,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        if ((bVar5 != false) &&
           ((long)(dest->normals).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)(dest->normals).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start != lVar12)) {
          pDVar13 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::operator<<((ostream *)local_1a8,"Read only ");
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::operator<<((ostream *)local_1a8," normals when should have read ");
          Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                    ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a8,
                     (uint *)dest);
          std::__cxx11::stringbuf::str();
          DeadlyImportError::DeadlyImportError(pDVar13,&local_1e0);
          __cxa_throw(pDVar13,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        if ((bVar6 != false) &&
           ((long)(dest->tangents).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)(dest->tangents).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start != lVar12)) {
          pDVar13 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::operator<<((ostream *)local_1a8,"Read only ");
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::operator<<((ostream *)local_1a8," tangents when should have read ");
          Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                    ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a8,
                     (uint *)dest);
          std::__cxx11::stringbuf::str();
          DeadlyImportError::DeadlyImportError(pDVar13,&local_1e0);
          __cxa_throw(pDVar13,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        pvVar16 = (dest->uvs).
                  super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar15 = 0;
        do {
          if ((ulong)(((long)(dest->uvs).
                             super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar16) / 0x18) <=
              uVar15) {
            return;
          }
          pvVar3 = pvVar16 + uVar15;
          pvVar1 = pvVar16 + uVar15;
          uVar15 = (ulong)((int)uVar15 + 1);
        } while ((long)(pvVar3->
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 *(long *)&(pvVar1->
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           )._M_impl.super__Vector_impl_data == lVar12);
        pDVar13 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::operator<<((ostream *)local_1a8,"Read only ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::operator<<((ostream *)local_1a8," uvs for uv index ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::operator<<((ostream *)local_1a8," when should have read ");
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a8,
                   (uint *)dest);
        std::__cxx11::stringbuf::str();
        DeadlyImportError::DeadlyImportError(pDVar13,&local_1e0);
        __cxa_throw(pDVar13,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      bVar8 = std::operator==(__lhs,"vertex");
      if (bVar8) {
        NextNode_abi_cxx11_(this);
      }
      bVar8 = bVar18;
      bVar2 = bVar7;
      if ((bVar4 == false) || (bVar9 = std::operator==(__lhs,"position"), !bVar9)) break;
      local_1a8 = (undefined1  [8])0x0;
      local_1a0 = 0.0;
      fVar19 = ReadAttribute<float>(this,"x");
      local_1a8._0_4_ = fVar19;
      fVar19 = ReadAttribute<float>(this,"y");
      local_1a8._4_4_ = fVar19;
      local_1a0 = ReadAttribute<float>(this,"z");
      this_00 = local_1b0;
LAB_00441f99:
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                (this_00,(value_type *)local_1a8);
LAB_0044202d:
      bVar7 = bVar2;
      bVar18 = bVar8;
      NextNode_abi_cxx11_(this);
    }
    if ((bVar5 != false) && (bVar9 = std::operator==(__lhs,"normal"), bVar9)) {
      local_1a8 = (undefined1  [8])0x0;
      local_1a0 = 0.0;
      fVar19 = ReadAttribute<float>(this,"x");
      local_1a8._0_4_ = fVar19;
      fVar19 = ReadAttribute<float>(this,"y");
      local_1a8._4_4_ = fVar19;
      local_1a0 = ReadAttribute<float>(this,"z");
      this_00 = local_1b8;
      goto LAB_00441f99;
    }
    if ((bVar6 != false) && (bVar9 = std::operator==(__lhs,"tangent"), bVar9)) {
      local_1a8 = (undefined1  [8])0x0;
      local_1a0 = 0.0;
      fVar19 = ReadAttribute<float>(this,"x");
      local_1a8._0_4_ = fVar19;
      fVar19 = ReadAttribute<float>(this,"y");
      local_1a8._4_4_ = fVar19;
      local_1a0 = ReadAttribute<float>(this,"z");
      this_00 = local_1c0;
      goto LAB_00441f99;
    }
    if ((local_1fc == 0) || (bVar9 = std::operator==(__lhs,"texcoord"), !bVar9)) {
      bVar9 = std::operator==(__lhs,"binormal");
      if (bVar9) {
        bVar8 = false;
        if (bVar18) goto LAB_00441fcc;
      }
      else {
        bVar18 = std::operator==(__lhs,"colour_diffuse");
        if (bVar18) {
          bVar2 = false;
          if (bVar7) {
LAB_00441fcc:
            pLVar11 = DefaultLogger::get();
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[59]>
                      ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,
                       (char (*) [59])"Vertex buffer attribute read not implemented for element: ");
            std::operator<<((ostream *)local_1a8,(string *)__lhs);
            std::__cxx11::stringbuf::str();
            Logger::warn(pLVar11,local_1e0._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&local_1e0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          }
        }
        else {
          bVar18 = std::operator==(__lhs,"colour_specular");
          if (!bVar18 || bVar14) {
            bVar14 = (bool)(bVar14 & !bVar18);
            goto LAB_00441fcc;
          }
          bVar14 = false;
        }
      }
      goto LAB_0044202d;
    }
    pvVar1 = (dest->uvs).
             super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar16 = (dest->uvs).
                   super__Vector_base<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pvVar16 != pvVar1;
        pvVar16 = pvVar16 + 1) {
      bVar8 = std::operator!=(__lhs,"texcoord");
      if (bVar8) {
        pDVar13 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)local_1a8,
                   "Vertex buffer declared more UVs than can be found in a vertex",
                   (allocator *)&local_1e0);
        DeadlyImportError::DeadlyImportError(pDVar13,(string *)local_1a8);
        __cxa_throw(pDVar13,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      local_1a8 = (undefined1  [8])0x0;
      local_1a0 = 0.0;
      fVar19 = ReadAttribute<float>(this,"u");
      local_1a8._0_4_ = fVar19;
      fVar19 = ReadAttribute<float>(this,"v");
      local_1a8._4_4_ = 1.0 - fVar19;
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                (pvVar16,(value_type *)local_1a8);
      NextNode_abi_cxx11_(this);
    }
  } while( true );
}

Assistant:

void OgreXmlSerializer::ReadGeometryVertexBuffer(VertexDataXml *dest)
{
    bool positions = (HasAttribute("positions") && ReadAttribute<bool>("positions"));
    bool normals   = (HasAttribute("normals") && ReadAttribute<bool>("normals"));
    bool tangents  = (HasAttribute("tangents") && ReadAttribute<bool>("tangents"));
    uint32_t uvs   = (HasAttribute("texture_coords") ? ReadAttribute<uint32_t>("texture_coords") : 0);

    // Not having positions is a error only if a previous vertex buffer did not have them.
    if (!positions && !dest->HasPositions()) {
        throw DeadlyImportError("Vertex buffer does not contain positions!");
    }

    if (positions)
    {
        ASSIMP_LOG_DEBUG("    - Contains positions");
        dest->positions.reserve(dest->count);
    }
    if (normals)
    {
        ASSIMP_LOG_DEBUG("    - Contains normals");
        dest->normals.reserve(dest->count);
    }
    if (tangents)
    {
        ASSIMP_LOG_DEBUG("    - Contains tangents");
        dest->tangents.reserve(dest->count);
    }
    if (uvs > 0)
    {
        ASSIMP_LOG_DEBUG_F( "    - Contains ", uvs, " texture coords");
        dest->uvs.resize(uvs);
        for(size_t i=0, len=dest->uvs.size(); i<len; ++i) {
            dest->uvs[i].reserve(dest->count);
        }
    }

    bool warnBinormal = true;
    bool warnColorDiffuse = true;
    bool warnColorSpecular = true;

    NextNode();

    while(m_currentNodeName == nnVertex       ||
          m_currentNodeName == nnPosition     ||
          m_currentNodeName == nnNormal       ||
          m_currentNodeName == nnTangent      ||
          m_currentNodeName == nnBinormal     ||
          m_currentNodeName == nnTexCoord     ||
          m_currentNodeName == nnColorDiffuse ||
          m_currentNodeName == nnColorSpecular)
    {
        if (m_currentNodeName == nnVertex) {
            NextNode();
        }

        /// @todo Implement nnBinormal, nnColorDiffuse and nnColorSpecular

        if (positions && m_currentNodeName == nnPosition)
        {
            aiVector3D pos;
            pos.x = ReadAttribute<float>(anX);
            pos.y = ReadAttribute<float>(anY);
            pos.z = ReadAttribute<float>(anZ);
            dest->positions.push_back(pos);
        }
        else if (normals && m_currentNodeName == nnNormal)
        {
            aiVector3D normal;
            normal.x = ReadAttribute<float>(anX);
            normal.y = ReadAttribute<float>(anY);
            normal.z = ReadAttribute<float>(anZ);
            dest->normals.push_back(normal);
        }
        else if (tangents && m_currentNodeName == nnTangent)
        {
            aiVector3D tangent;
            tangent.x = ReadAttribute<float>(anX);
            tangent.y = ReadAttribute<float>(anY);
            tangent.z = ReadAttribute<float>(anZ);
            dest->tangents.push_back(tangent);
        }
        else if (uvs > 0 && m_currentNodeName == nnTexCoord)
        {
            for(auto &uvs : dest->uvs)
            {
                if (m_currentNodeName != nnTexCoord) {
                    throw DeadlyImportError("Vertex buffer declared more UVs than can be found in a vertex");
                }

                aiVector3D uv;
                uv.x = ReadAttribute<float>("u");
                uv.y = (ReadAttribute<float>("v") * -1) + 1; // Flip UV from Ogre to Assimp form
                uvs.push_back(uv);

                NextNode();
            }
            // Continue main loop as above already read next node
            continue;
        }
        else
        {
            /// @todo Remove this stuff once implemented. We only want to log warnings once per element.
            bool warn = true;
            if (m_currentNodeName == nnBinormal)
            {
                if (warnBinormal)
                {
                    warnBinormal = false;
                }
                else
                {
                    warn = false;
                }
            }
            else if (m_currentNodeName == nnColorDiffuse)
            {
                if (warnColorDiffuse)
                {
                    warnColorDiffuse = false;
                }
                else
                {
                    warn = false;
                }
            }
            else if (m_currentNodeName == nnColorSpecular)
            {
                if (warnColorSpecular)
                {
                    warnColorSpecular = false;
                }
                else
                {
                    warn = false;
                }
            }
            if (warn) {
                ASSIMP_LOG_WARN_F("Vertex buffer attribute read not implemented for element: ", m_currentNodeName);
            }
        }

        // Advance
        NextNode();
    }

    // Sanity checks
    if (dest->positions.size() != dest->count) {
      throw DeadlyImportError(Formatter::format() << "Read only " << dest->positions.size() << " positions when should have read " << dest->count);
    }
    if (normals && dest->normals.size() != dest->count) {
        throw DeadlyImportError(Formatter::format() << "Read only " << dest->normals.size() << " normals when should have read " << dest->count);
    }
    if (tangents && dest->tangents.size() != dest->count) {
        throw DeadlyImportError(Formatter::format() << "Read only " << dest->tangents.size() << " tangents when should have read " << dest->count);
    }
    for(unsigned int i=0; i<dest->uvs.size(); ++i)
    {
        if (dest->uvs[i].size() != dest->count) {
            throw DeadlyImportError(Formatter::format() << "Read only " << dest->uvs[i].size()
                << " uvs for uv index " << i << " when should have read " << dest->count);
        }
    }
}